

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas3_d.cpp
# Opt level: O1

void dtrmm(char side,char uplo,char transa,char diag,int m,int n,double alpha,double *a,int lda,
          double *b,int ldb)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  undefined7 in_register_00000009;
  double *pdVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  undefined7 in_register_00000039;
  double *pdVar17;
  long lVar18;
  uint info;
  ulong uVar19;
  double *pdVar20;
  double dVar21;
  string local_98;
  undefined4 local_74;
  double local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  bool local_58;
  undefined7 uStack_57;
  ulong local_50;
  char local_41;
  ulong local_40;
  char local_31;
  
  _local_60 = CONCAT44(uStack_5c,(int)CONCAT71(in_register_00000011,transa));
  _local_68 = CONCAT44(uStack_64,(int)CONCAT71(in_register_00000039,side));
  local_70 = alpha;
  bVar2 = lsame(side,'L');
  local_74 = (undefined4)CONCAT71(in_register_00000009,diag);
  local_31 = lsame(diag,'N');
  bVar3 = lsame(uplo,'U');
  _local_58 = CONCAT71(uStack_57,bVar3);
  local_50 = (ulong)(uint)m;
  local_41 = bVar2;
  local_40 = (ulong)(uint)n;
  if (!bVar2) {
    bVar2 = lsame((char)local_68,'R');
    m = n;
    if (!bVar2) {
      info = 1;
      uVar12 = 0;
      uVar7 = local_50;
      goto LAB_002163c7;
    }
  }
  if ((local_58 != false) || (bVar2 = lsame(uplo,'L'), bVar2)) {
    cVar1 = (char)local_60;
    bVar2 = lsame((char)local_60,'N');
    if ((bVar2) || ((bVar2 = lsame(cVar1,'T'), bVar2 || (bVar2 = lsame(cVar1,'C'), bVar2)))) {
      cVar1 = (char)local_74;
      bVar2 = lsame((char)local_74,'U');
      if ((bVar2) || (bVar2 = lsame(cVar1,'N'), bVar2)) {
        uVar7 = local_50;
        iVar5 = (int)local_50;
        if (iVar5 < 0) {
          info = 5;
        }
        else {
          if (-1 < (int)local_40) {
            iVar4 = i4_max(1,m);
            uVar12 = 0;
            if (lda < iVar4) {
              info = 9;
            }
            else {
              iVar5 = i4_max(1,iVar5);
              info = 0xb;
              if (iVar5 <= ldb) {
                info = uVar12;
              }
              uVar12 = (uint)(iVar5 <= ldb);
            }
            goto LAB_002163c7;
          }
          info = 6;
        }
        uVar12 = 0;
        goto LAB_002163c7;
      }
      info = 4;
    }
    else {
      info = 3;
    }
  }
  else {
    info = 2;
  }
  uVar12 = 0;
  uVar7 = local_50;
LAB_002163c7:
  if ((char)uVar12 == '\0') {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"DTRMM","");
    xerbla(&local_98,info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  else if ((int)local_40 != 0) {
    iVar5 = (int)uVar7;
    if ((local_70 != 0.0) || (NAN(local_70))) {
      if (local_41 == '\0') {
        bVar2 = lsame((char)local_60,'n');
        if (bVar2) {
          if (local_58 == false) {
            if (0 < (int)local_40) {
              lVar18 = (long)ldb;
              local_40 = local_40 & 0xffffffff;
              pdVar9 = b + lVar18;
              uVar19 = 1;
              uVar13 = 0;
              do {
                dVar21 = local_70;
                if (local_31 != '\0') {
                  dVar21 = a[(lda + 1) * (int)uVar13] * local_70;
                }
                if (0 < iVar5) {
                  uVar14 = 0;
                  do {
                    b[uVar14] = b[uVar14] * dVar21;
                    uVar14 = uVar14 + 1;
                  } while ((uVar7 & 0xffffffff) != uVar14);
                }
                uVar14 = uVar13 + 1;
                if (uVar14 < local_40) {
                  pdVar17 = pdVar9;
                  uVar10 = uVar19;
                  do {
                    dVar21 = a[uVar13 * (long)lda + uVar10];
                    if (((dVar21 != 0.0) || (NAN(dVar21))) && (0 < iVar5)) {
                      uVar16 = 0;
                      do {
                        b[uVar16] = pdVar17[uVar16] * dVar21 * local_70 + b[uVar16];
                        uVar16 = uVar16 + 1;
                      } while ((uVar7 & 0xffffffff) != uVar16);
                    }
                    uVar10 = uVar10 + 1;
                    pdVar17 = pdVar17 + lVar18;
                  } while (uVar10 != local_40);
                }
                uVar19 = uVar19 + 1;
                b = b + lVar18;
                pdVar9 = pdVar9 + lVar18;
                uVar13 = uVar14;
              } while (uVar14 != local_40);
            }
          }
          else if (0 < (int)local_40) {
            uVar14 = (ulong)((int)local_40 - 1);
            lVar18 = (long)ldb;
            pdVar9 = b + ((local_40 & 0xffffffff) - 1) * lVar18;
            uVar13 = local_40 & 0xffffffff;
            uVar19 = uVar7;
            do {
              uVar10 = uVar13 - 1;
              dVar21 = local_70;
              if (local_31 != '\0') {
                dVar21 = a[(lda + 1) * (int)uVar10] * local_70;
              }
              if (0 < (int)uVar19) {
                uVar19 = 0;
                do {
                  pdVar9[uVar19] = pdVar9[uVar19] * dVar21;
                  uVar19 = uVar19 + 1;
                } while ((uVar7 & 0xffffffff) != uVar19);
              }
              if (1 < (long)uVar13) {
                uVar19 = 0;
                pdVar17 = b;
                do {
                  dVar21 = a[uVar10 * (long)lda + uVar19];
                  if (((dVar21 != 0.0) || (NAN(dVar21))) && (0 < (int)local_50)) {
                    uVar16 = 0;
                    do {
                      pdVar9[uVar16] = pdVar17[uVar16] * dVar21 * local_70 + pdVar9[uVar16];
                      uVar16 = uVar16 + 1;
                    } while ((uVar7 & 0xffffffff) != uVar16);
                  }
                  uVar19 = uVar19 + 1;
                  pdVar17 = pdVar17 + lVar18;
                } while (uVar19 != uVar14);
              }
              uVar14 = uVar14 - 1;
              pdVar9 = pdVar9 + -lVar18;
              bVar2 = 1 < (long)uVar13;
              uVar13 = uVar10;
              uVar19 = local_50;
            } while (bVar2);
          }
        }
        else if (local_58 == false) {
          if (0 < (int)local_40) {
            uVar19 = local_40 & 0xffffffff;
            lVar18 = (long)ldb;
            pdVar9 = b + (uVar19 - 1) * lVar18;
            pdVar17 = b + lVar18 * uVar19;
            uVar13 = uVar19;
            do {
              uVar14 = uVar13 - 1;
              if ((long)uVar13 < (long)uVar19) {
                pdVar20 = pdVar17;
                uVar10 = uVar13;
                do {
                  dVar21 = a[uVar14 * (long)lda + uVar10];
                  if (((dVar21 != 0.0) || (NAN(dVar21))) && (0 < (int)local_50)) {
                    uVar16 = 0;
                    do {
                      pdVar20[uVar16] = pdVar9[uVar16] * dVar21 * local_70 + pdVar20[uVar16];
                      uVar16 = uVar16 + 1;
                    } while ((uVar7 & 0xffffffff) != uVar16);
                  }
                  uVar10 = uVar10 + 1;
                  pdVar20 = pdVar20 + lVar18;
                } while ((int)uVar10 != (int)local_40);
              }
              dVar21 = local_70;
              if (local_31 != '\0') {
                dVar21 = a[(lda + 1) * (int)uVar14] * local_70;
              }
              if (dVar21 != 1.0 && 0 < (int)local_50) {
                uVar10 = 0;
                do {
                  pdVar9[uVar10] = pdVar9[uVar10] * dVar21;
                  uVar10 = uVar10 + 1;
                } while ((uVar7 & 0xffffffff) != uVar10);
              }
              pdVar9 = pdVar9 + -lVar18;
              pdVar17 = pdVar17 + -lVar18;
              bVar2 = 1 < (long)uVar13;
              uVar13 = uVar14;
            } while (bVar2);
          }
        }
        else if (0 < (int)local_40) {
          uVar13 = 0;
          pdVar9 = b;
          do {
            if (uVar13 != 0) {
              uVar19 = 0;
              pdVar17 = b;
              do {
                dVar21 = a[uVar13 * (long)lda + uVar19];
                if (((dVar21 != 0.0) || (NAN(dVar21))) && (0 < iVar5)) {
                  uVar14 = 0;
                  do {
                    pdVar17[uVar14] = pdVar9[uVar14] * dVar21 * local_70 + pdVar17[uVar14];
                    uVar14 = uVar14 + 1;
                  } while ((uVar7 & 0xffffffff) != uVar14);
                }
                uVar19 = uVar19 + 1;
                pdVar17 = pdVar17 + ldb;
              } while (uVar19 != uVar13);
            }
            dVar21 = local_70;
            if (local_31 != '\0') {
              dVar21 = a[(lda + 1) * (int)uVar13] * local_70;
            }
            if (dVar21 != 1.0 && 0 < iVar5) {
              uVar19 = 0;
              do {
                pdVar9[uVar19] = pdVar9[uVar19] * dVar21;
                uVar19 = uVar19 + 1;
              } while ((uVar7 & 0xffffffff) != uVar19);
            }
            uVar13 = uVar13 + 1;
            pdVar9 = pdVar9 + ldb;
          } while (uVar13 != (local_40 & 0xffffffff));
        }
      }
      else {
        bVar2 = lsame((char)local_60,'N');
        if (bVar2) {
          if (local_58 == false) {
            if (0 < (int)local_40) {
              lVar18 = (long)iVar5;
              pdVar9 = b + lVar18;
              uVar13 = 0;
              do {
                if (0 < (int)uVar7) {
                  lVar8 = uVar13 * (long)ldb;
                  iVar5 = 0;
                  lVar6 = lVar18;
                  pdVar17 = a + (lVar18 + -1) * (long)lda + lVar18;
                  pdVar20 = pdVar9;
                  do {
                    lVar11 = lVar6 + -1;
                    dVar21 = b[lVar8 + lVar6 + -1];
                    if ((dVar21 != 0.0) || (NAN(dVar21))) {
                      dVar21 = dVar21 * local_70;
                      b[lVar8 + lVar11] = dVar21;
                      if (local_31 != '\0') {
                        b[lVar8 + lVar11] = a[(lda + 1) * (int)lVar11] * dVar21;
                      }
                      if (lVar6 < lVar18) {
                        lVar15 = 0;
                        do {
                          pdVar20[lVar15] = pdVar17[lVar15] * dVar21 + pdVar20[lVar15];
                          lVar15 = lVar15 + 1;
                        } while (iVar5 != (int)lVar15);
                      }
                    }
                    pdVar17 = pdVar17 + ~(long)lda;
                    pdVar20 = pdVar20 + -1;
                    iVar5 = iVar5 + 1;
                    bVar2 = 1 < lVar6;
                    lVar6 = lVar11;
                  } while (bVar2);
                }
                uVar13 = uVar13 + 1;
                pdVar9 = pdVar9 + ldb;
                uVar7 = local_50;
              } while (uVar13 != (local_40 & 0xffffffff));
            }
          }
          else if (0 < (int)local_40) {
            uVar13 = 0;
            pdVar9 = b;
            do {
              if (0 < iVar5) {
                lVar18 = uVar13 * (long)ldb;
                uVar19 = 0;
                pdVar17 = a;
                do {
                  dVar21 = b[lVar18 + uVar19];
                  if ((dVar21 != 0.0) || (NAN(dVar21))) {
                    dVar21 = dVar21 * local_70;
                    if (uVar19 != 0) {
                      uVar14 = 0;
                      do {
                        pdVar9[uVar14] = pdVar17[uVar14] * dVar21 + pdVar9[uVar14];
                        uVar14 = uVar14 + 1;
                      } while (uVar19 != uVar14);
                    }
                    if (local_31 != '\0') {
                      dVar21 = dVar21 * a[(lda + 1) * (int)uVar19];
                    }
                    b[lVar18 + uVar19] = dVar21;
                  }
                  uVar19 = uVar19 + 1;
                  pdVar17 = pdVar17 + lda;
                } while (uVar19 != (uVar7 & 0xffffffff));
              }
              uVar13 = uVar13 + 1;
              pdVar9 = pdVar9 + ldb;
            } while (uVar13 != (local_40 & 0xffffffff));
          }
        }
        else if (local_58 == false) {
          if (0 < (int)local_40) {
            uVar19 = 0;
            pdVar9 = b;
            uVar13 = uVar7;
            do {
              if (0 < (int)uVar13) {
                lVar18 = uVar19 * (long)ldb;
                uVar13 = 0;
                pdVar17 = pdVar9;
                uVar14 = uVar7 & 0xffffffff;
                pdVar20 = a;
                do {
                  dVar21 = b[lVar18 + uVar13];
                  if (local_31 != '\0') {
                    dVar21 = dVar21 * a[(lda + 1) * (int)uVar13];
                  }
                  uVar10 = uVar13 + 1;
                  if ((long)uVar10 < (long)iVar5) {
                    uVar16 = 1;
                    do {
                      dVar21 = dVar21 + pdVar20[uVar16] * pdVar17[uVar16];
                      uVar16 = uVar16 + 1;
                    } while (uVar14 != uVar16);
                  }
                  b[lVar18 + uVar13] = dVar21 * local_70;
                  pdVar17 = pdVar17 + 1;
                  pdVar20 = pdVar20 + (long)lda + 1;
                  uVar14 = uVar14 - 1;
                  uVar13 = uVar10;
                } while (uVar10 != (uVar7 & 0xffffffff));
              }
              uVar19 = uVar19 + 1;
              pdVar9 = pdVar9 + ldb;
              uVar13 = local_50;
            } while (uVar19 != (local_40 & 0xffffffff));
          }
        }
        else if (0 < (int)local_40) {
          uVar13 = 0;
          pdVar9 = b;
          do {
            if (0 < (int)uVar7) {
              lVar6 = uVar13 * (long)ldb;
              uVar7 = (ulong)(iVar5 - 1);
              lVar18 = (long)iVar5;
              pdVar17 = a + ((long)iVar5 + -1) * (long)lda;
              do {
                lVar8 = lVar18 + -1;
                dVar21 = b[lVar6 + lVar18 + -1];
                if (local_31 != '\0') {
                  dVar21 = dVar21 * a[(lda + 1) * (int)lVar8];
                }
                if (1 < lVar18) {
                  uVar19 = 0;
                  do {
                    dVar21 = dVar21 + pdVar17[uVar19] * pdVar9[uVar19];
                    uVar19 = uVar19 + 1;
                  } while (uVar7 != uVar19);
                }
                b[lVar6 + lVar8] = dVar21 * local_70;
                uVar7 = uVar7 - 1;
                pdVar17 = pdVar17 + -(long)lda;
                bVar2 = 1 < lVar18;
                lVar18 = lVar8;
              } while (bVar2);
            }
            uVar13 = uVar13 + 1;
            pdVar9 = pdVar9 + ldb;
            uVar7 = local_50;
          } while (uVar13 != (local_40 & 0xffffffff));
        }
      }
    }
    else if (0 < (int)local_40) {
      uVar13 = local_40 & 0xffffffff;
      iVar4 = 0;
      do {
        if (0 < iVar5) {
          memset(b + iVar4,0,(uVar7 & 0xffffffff) << 3);
        }
        iVar4 = iVar4 + ldb;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
  }
  return;
}

Assistant:

void dtrmm ( char side, char uplo, char transa, char diag, int m, int n, 
  double alpha, double a[], int lda, double b[], int ldb )

//****************************************************************************80
//
//  Purpose:
//
//    DTRMM performs B:=A*B or B:=B*A, A triangular, B rectangular.
//
//  Discussion:
//
//    This routine performs one of the matrix-matrix operations
//      B := alpha*op( A )*B,
//    or
//      B := alpha*B*op( A ),
//    where  alpha  is a scalar,  B  is an m by n matrix,  A  is a unit, or
//    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of
//      op( A ) = A   or   op( A ) = A'.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char SIDE, specifies whether op(A) multiplies B from
//    the left or right as follows:
//    'L' or 'l': B := alpha*op( A )*B.
//    'R' or 'r': B := alpha*B*op( A ).
//
//    Input, char UPLO, specifies whether the matrix A is an upper or
//    lower triangular matrix as follows:
//    'U' or 'u': A is an upper triangular matrix.
//    'L' or 'l': A is a lower triangular matrix.
//
//    Input, char TRANS, specifies the form of op( A ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n': op( A ) = A.
//    'T' or 't': op( A ) = A'.
//    'C' or 'c': op( A ) = A'.
//
//    Input, char DIAG, specifies whether or not A is unit triangular
//    as follows:
//    'U' or 'u': A is assumed to be unit triangular.
//    'N' or 'n': A is not assumed to be unit triangular.
//
//    Input, int M, the number of rows of B.  0 <= M.
//
//    Input, int N, the number of columns of B.  
//    0 <= N.
//
//    Input, double ALPHA, the scalar  alpha.  When alpha is
//    0.0, A is not referenced and B need not be set before entry.
//
//    Input, double A[LDA*K], where k is m when  SIDE = 'L' or 'l'  
//    and is  n  when  SIDE = 'R' or 'r'.
//    Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
//    upper triangular part of the array  A must contain the upper
//    triangular matrix  and the strictly lower triangular part of
//    A is not referenced.
//    Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
//    lower triangular part of the array  A must contain the lower
//    triangular matrix  and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'U' or 'u',  the diagonal elements of
//    A  are not referenced either,  but are assumed to be  unity.
//
//    Input, integer LDA, the first dimension of A as declared
//    in the calling program.  When SIDE = 'L' or 'l' then LDA must be at 
//    least max ( 1, M ); when SIDE = 'R' or 'r', LDA must be at least 
//    max ( 1, N ).
//
//    Input/output, double B[LDB*N].
//    Before entry, the leading m by n part of the array  B must contain 
//    the matrix  B, and on exit is overwritten by the transformed matrix.
//
//    Input, integer LDB, the first dimension of B as declared
//    in the calling program.   max ( 1, M ) <= LDB.
//
{
  int i;
  int info;
  int j;
  int k;
  int lside;
  int nounit;
  int nrowa;
  double temp;
  int upper;
//
//  Test the input parameters.
//
  lside = lsame ( side, 'L' );

  if ( lside )
  {
    nrowa = m;
  }
  else
  {
    nrowa = n;
  }

  nounit = lsame ( diag, 'N' );
  upper = lsame ( uplo, 'U' );

  info = 0;
  if ( ! lside && ! lsame ( side, 'R' ) )
  {
    info = 1;
  }
  else if ( ! upper && ! lsame ( uplo, 'L' ) )
  {
    info = 2;
  }
  else if ( ! lsame ( transa, 'N' ) && ! lsame ( transa, 'T' ) && 
            ! lsame ( transa, 'C' ) )
  {
    info = 3;
  }
  else if ( ! lsame ( diag, 'U' ) && ! lsame ( diag, 'N' ) )
  {
    info = 4;
  }
  else if ( m < 0 )
  {
    info = 5;
  }
  else if ( n < 0 )
  {
    info = 6;
  }
  else if ( lda < i4_max ( 1, nrowa ) )
  {
    info = 9;
  }
  else if ( ldb < i4_max ( 1, m ) )
  {
    info = 11;
  }

  if ( info != 0 ) 
  {
    xerbla ( "DTRMM", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 )
  {
    return;
  }
//
//  And when alpha is 0.0.
//
  if ( alpha == 0.0 )
  {
    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        b[i+j*ldb] = 0.0;
      }
    }
    return;
  }
//
//  Start the operations.
//
  if ( lside )
  {
//
//  Form  B := alpha*A*B.
//
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( k = 0; k < m; k++ )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              temp = alpha * b[k+j*ldb];
              for ( i = 0; i < k; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * a[i+k*lda];
              }
              if ( nounit )
              {
                temp = temp * a[k+k*lda];
              }
              b[k+j*ldb] = temp;
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( k = m - 1; 0 <= k; k-- )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              temp = alpha * b[k+j*ldb];
              b[k+j*ldb] = temp;
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] * a[k+k*lda];
              }
              for ( i = k + 1; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * a[i+k*lda];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*A'*B.
//
    else
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = m - 1; 0 <= i; i-- )
          {
            temp = b[i+j*ldb];
            if ( nounit )
            {
              temp = temp * a[i+i*lda];
            }
            for ( k = 0; k < i; k++ )
            {
              temp = temp + a[k+i*lda] * b[k+j*ldb];
            }
            b[i+j*ldb] = alpha * temp;
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = 0; i < m; i++ )
          {
            temp = b[i+j*ldb];
            if ( nounit )
            {
              temp = temp * a[i+i*lda];
            }
            for ( k = i + 1; k < m; k++ )
            {
              temp = temp + a[k+i*lda] * b[k+j*ldb];
            }
            b[i+j*ldb] = alpha * temp;
          }
        }
      }
    }
  }
//
//  Form  B := alpha*B*A.
//
  else
  {
    if ( lsame ( transa, 'n' ) )
    {
      if ( upper )
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = 0; i < m; i++ )
          {
            b[i+j*ldb] = temp * b[i+j*ldb];
          }
          for ( k = 0; k < j; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              temp = alpha * a[k+j*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[j+j*lda];
          }
          for ( i = 0; i < m; i++ )
          {
            b[i+j*ldb] = temp * b[i+j*ldb];
          }
          for ( k = j + 1; k < n; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              temp = alpha * a[k+j*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*B*A'.
//
    else
    {
      if ( upper )
      {
        for ( k = 0; k < n; k++ )
        {
          for ( j = 0; j < k; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = alpha * a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[k+k*lda];
          }
          if ( temp != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
        }
      }
      else
      {
        for ( k = n - 1; 0 <= k; k-- )
        {
          for ( j = k + 1; j < n; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = alpha * a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] + temp * b[i+k*ldb];
              }
            }
          }
          temp = alpha;
          if ( nounit )
          {
            temp = temp * a[k+k*lda];
          }
          if ( temp != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
        }
      }
    }
  }
  return;
}